

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall front::syntax::SyntaxAnalyze::gm_var_def(SyntaxAnalyze *this)

{
  element_type *peVar1;
  long lVar2;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *op2;
  int id;
  pointer pWVar3;
  _Base_ptr this_00;
  element_type *peVar4;
  pointer pcVar5;
  string name_00;
  string name_01;
  string name_02;
  _Base_ptr p_Var6;
  irGenerator *this_01;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  shared_ptr<front::express::ExpressNode> *value_1;
  ulong uVar12;
  ArraySymbol *this_02;
  IntSymbol *this_03;
  mapped_type *pmVar13;
  pointer psVar14;
  mapped_type *pmVar15;
  int *__args;
  shared_ptr<front::express::ExpressNode> *value;
  _Base_ptr p_Var16;
  long lVar17;
  pointer psVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  char *pcVar20;
  element_type *peVar21;
  byte *pbVar22;
  _Alloc_hider _Var23;
  SyntaxAnalyze *pSVar24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  bool bVar26;
  SharedSyPtr symbol;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inits;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  init_values;
  string addrTmp;
  string addr;
  string name;
  string initPtr;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  dimensions;
  string valueName;
  undefined1 in_stack_fffffffffffffa2c [12];
  ArraySymbol *this_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var27;
  undefined1 local_5b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  byte local_598;
  SyntaxAnalyze *local_588;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_580;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  local_578;
  undefined1 local_558 [16];
  element_type local_548;
  undefined1 local_528 [8];
  _Base_ptr local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  undefined1 local_4f8 [16];
  _Base_ptr local_4e8;
  _Base_ptr local_4e0;
  undefined1 local_4d8 [24];
  _Base_ptr p_Stack_4c0;
  _Base_ptr local_4b8;
  value_type local_4a8;
  irGenerator *local_498;
  string local_490;
  undefined1 local_470 [32];
  undefined1 local_450 [16];
  _Alloc_hider local_440;
  undefined1 local_438 [16];
  value_type local_428;
  string local_418;
  string local_3f8;
  pointer local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider local_3c0;
  undefined1 local_3b8 [16];
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  undefined1 local_388;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  byte local_360;
  undefined1 local_358 [32];
  byte local_338;
  undefined1 local_330 [32];
  byte local_310;
  _Base_ptr local_308 [2];
  undefined1 local_2f8 [16];
  _Base_ptr local_2e8 [2];
  _Base_ptr local_2d8 [2];
  string local_2c8;
  _Base_ptr local_2a8 [2];
  undefined1 local_298 [16];
  string local_288;
  string local_268;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  string local_228;
  string local_208;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  byte local_1c8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  byte local_1a0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  byte local_178;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  byte local_150;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  byte local_128;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  byte local_100;
  RightVal local_f8;
  RightVal local_d0;
  RightVal local_a8;
  undefined1 local_80 [72];
  byte local_38;
  
  local_508._M_allocated_capacity = (size_type)local_4f8;
  local_508._8_8_ = 0;
  local_4f8[0] = _S_red;
  local_4a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_4a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4b8 = (_Base_ptr)0x0;
  local_4d8._16_8_ = (_Base_ptr)0x0;
  p_Stack_4c0 = (_Base_ptr)0x0;
  local_578.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_578.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_04 = (ArraySymbol *)0x0;
  this_05._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  match_one_word(this,IDENFR);
  word::Word::get_self_abi_cxx11_
            ((string *)local_5b8,
             (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + this->matched_index);
  std::__cxx11::string::operator=((string *)local_508._M_local_buf,(string *)local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._0_8_ != &local_5a8) {
    operator_delete((void *)local_5b8._0_8_,local_5a8._M_allocated_capacity + 1);
  }
  uVar12 = this->matched_index + 1;
  pWVar3 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar26 = false;
  local_548.initValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage =
       (pointer)((ulong)local_548.initValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  if (uVar12 < (ulong)(((long)(this->word_list->
                              super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar3 >> 4) *
                      -0x5555555555555555)) {
    bVar7 = word::Word::match_token(pWVar3 + uVar12,LBRACK);
    bVar26 = false;
    local_548.initValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)local_548.initValues.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
    if (bVar7) {
      while( true ) {
        uVar12 = this->matched_index + 1;
        pWVar3 = (this->word_list->
                 super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_548.initValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(local_548.initValues.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,2);
        bVar26 = true;
        if ((ulong)(((long)(this->word_list->
                           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar3 >> 4) *
                   -0x5555555555555555) <= uVar12) break;
        bVar7 = word::Word::match_token(pWVar3 + uVar12,LBRACK);
        if (!bVar7) break;
        match_one_word(this,LBRACK);
        gm_exp((SyntaxAnalyze *)local_5b8);
        _Var27._M_pi = local_4a8.
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        local_4a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_;
        local_4a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)local_5b8._0_8_;
        local_5b8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_5b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var27._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var27._M_pi);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_);
          }
        }
        std::
        vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                     *)(local_4d8 + 0x10),&local_4a8);
        match_one_word(this,RBRACK);
      }
    }
  }
  uVar12 = this->matched_index + 1;
  pWVar3 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar12 < (ulong)(((long)(this->word_list->
                              super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar3 >> 4) *
                      -0x5555555555555555)) {
    bVar7 = word::Word::match_token(pWVar3 + uVar12,ASSIGN);
    if (bVar7) {
      match_one_word(this,ASSIGN);
      uVar12 = this->matched_index + 1;
      pWVar3 = (this->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar12 < (ulong)(((long)(this->word_list->
                                  super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar3 >> 4) *
                          -0x5555555555555555)) {
        bVar7 = word::Word::match_token(pWVar3 + uVar12,LBRACE);
        if (bVar7) {
          match_one_word(this,LBRACE);
          gm_init_val(this,&local_578,
                      (vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                       *)(local_4d8 + 0x10),0);
          match_one_word(this,RBRACE);
          goto LAB_001a0307;
        }
      }
      gm_init_val(this,&local_578,
                  (vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)(local_4d8 + 0x10),0);
    }
  }
LAB_001a0307:
  local_588 = this;
  if (bVar26) {
    local_5b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_5b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_5a8._M_allocated_capacity = 0;
    this_02 = (ArraySymbol *)operator_new(0x78);
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3f8,local_508._M_allocated_capacity,
               (undefined1 *)(local_508._8_8_ + local_508._M_allocated_capacity));
    front::symbol::IntSymbol::getHolderIntSymbol();
    front::symbol::ArraySymbol::ArraySymbol
              (this_02,&local_3f8,(SharedSyPtr *)local_3b8,local_588->layer_num,false,false);
    pcVar20 = (char *)0x0;
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::ArraySymbol>
              ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xfffffffffffffa38,this_02);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._0_8_ + 1);
    }
    p_Var6 = p_Stack_4c0;
    if ((_Base_ptr)local_4d8._16_8_ != p_Stack_4c0) {
      pcVar20 = &__libc_single_threaded;
      p_Var16 = (_Base_ptr)local_4d8._16_8_;
      do {
        local_428.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = *(element_type **)p_Var16;
        this_00 = p_Var16->_M_parent;
        if (this_00 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          }
        }
        if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
          }
        }
        if (this_00 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          }
        }
        _Var27._M_pi = this_05._M_pi;
        local_428.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
        std::
        vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ::push_back(&this_04->_dimensions,&local_428);
        if ((_Base_ptr)
            local_428.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_428.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_05._M_pi);
        }
        this_05._M_pi = _Var27._M_pi;
        if (this_00 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
        p_Var16 = (_Base_ptr)&p_Var16->_M_left;
      } while (p_Var16 != p_Var6);
    }
    psVar14 = local_578.
              super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_588->layer_num == local_588->_initLayerNum) {
      if (local_578.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_578.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar10 = 0;
        pcVar20 = &__libc_single_threaded;
        while( true ) {
          if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
            }
          }
          _Var27._M_pi = this_05._M_pi;
          iVar9 = front::symbol::ArraySymbol::getLen(this_04);
          if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_05._M_pi);
          }
          this_05._M_pi = _Var27._M_pi;
          if (iVar9 <= iVar10) break;
          local_558._0_8_ = local_558._0_8_ & 0xffffffff00000000;
          if (local_5b8._8_8_ == local_5a8._M_allocated_capacity) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b8,
                       (iterator)local_5b8._8_8_,(uint *)local_558);
          }
          else {
            *(uint *)local_5b8._8_8_ = 0;
            local_5b8._8_8_ = local_5b8._8_8_ + 4;
          }
          iVar10 = iVar10 + 1;
        }
      }
      else {
        pcVar20 = &__libc_single_threaded;
        psVar18 = local_578.
                  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          peVar21 = (psVar18->
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          p_Var25 = (psVar18->
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
            }
          }
          if (peVar21->_type == 0) {
            local_558._0_4_ = peVar21->_value;
            if (local_5b8._8_8_ != local_5a8._M_allocated_capacity) {
              *(undefined4 *)local_5b8._8_8_ = local_558._0_4_;
              goto LAB_001a0535;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b8,
                       (iterator)local_5b8._8_8_,(uint *)local_558);
          }
          else {
            local_558._0_8_ = (ulong)(uint)local_558._4_4_ << 0x20;
            if (local_5b8._8_8_ == local_5a8._M_allocated_capacity) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b8,
                         (iterator)local_5b8._8_8_,(uint *)local_558);
            }
            else {
              *(uint *)local_5b8._8_8_ = 0;
LAB_001a0535:
              local_5b8._8_8_ = local_5b8._8_8_ + 4;
            }
          }
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          psVar18 = psVar18 + 1;
        } while (psVar18 != psVar14);
      }
    }
    if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
      }
    }
    _Var27._M_pi = this_05._M_pi;
    iVar8 = front::symbol::ArraySymbol::getLen(this_04);
    iVar11 = irGenerator::TopLocalSmallArrayLength;
    if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_05._M_pi);
    }
    iVar10 = (int)CONCAT71((int7)((ulong)pcVar20 >> 8),iVar11 < iVar8);
    bVar26 = local_578.
             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_578.
             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_418,local_508._M_allocated_capacity,
               (undefined1 *)(local_508._8_8_ + local_508._M_allocated_capacity));
    id = (this_04->super_Symbol).id;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3d0,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b8);
    if (_Var27._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var27._M_pi)->_M_use_count = (_Var27._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var27._M_pi)->_M_use_count = (_Var27._M_pi)->_M_use_count + 1;
      }
    }
    this_05._M_pi = _Var27._M_pi;
    iVar9 = front::symbol::ArraySymbol::getLen(this_04);
    irGenerator::irGenerator::ir_declare_value
              (&local_588->irGenerator,&local_418,
               (SymbolKind)
               local_548.initValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,id,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3d0,
               ((uint)(iVar11 < iVar8) * 2 - (uint)bVar26) + SmallInit,iVar9);
    if (_Var27._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var27._M_pi);
    }
    pSVar24 = local_588;
    if ((void *)local_3d0._M_allocated_capacity != (void *)0x0) {
      operator_delete((void *)local_3d0._M_allocated_capacity,(long)local_3c0._M_p - local_3d0._0_8_
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_001a0827;
    pbVar22 = (byte *)(local_5a8._M_allocated_capacity - local_5b8._0_8_);
    _Var23._M_p = (pointer)local_5b8._0_8_;
  }
  else {
    this_03 = (IntSymbol *)operator_new(0x40);
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,local_508._M_allocated_capacity,
               (undefined1 *)(local_508._8_8_ + local_508._M_allocated_capacity));
    front::symbol::IntSymbol::IntSymbol(this_03,&local_268,this->layer_num,false,0);
    iVar10 = 0;
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::IntSymbol>
              ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xfffffffffffffa38,this_03);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_298 + 0x10),local_508._M_allocated_capacity,
               (undefined1 *)(local_508._8_8_ + local_508._M_allocated_capacity));
    pSVar24 = local_588;
    local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar9 = 0;
    irGenerator::irGenerator::ir_declare_value
              (&local_588->irGenerator,(string *)(local_298 + 0x10),INT,(this_04->super_Symbol).id,
               &local_248,Var,0);
    if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_248.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p == &local_288.field_2) goto LAB_001a0827;
    pbVar22 = (byte *)(local_288.field_2._M_allocated_capacity + 1);
    _Var23._M_p = local_288._M_dataplus._M_p;
    iVar10 = 0;
  }
  operator_delete(_Var23._M_p,(ulong)pbVar22);
LAB_001a0827:
  if (local_578.
      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_578.
      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_2a8[0] = (_Base_ptr)local_298;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2a8,local_508._M_allocated_capacity,
               (undefined1 *)(local_508._8_8_ + local_508._M_allocated_capacity));
    peVar21 = (element_type *)&pSVar24->irGenerator;
    name_00._4_12_ = in_stack_fffffffffffffa2c;
    name_00._M_dataplus._M_p._0_4_ = iVar9;
    name_00.field_2._M_allocated_capacity = (size_type)this_04;
    name_00.field_2._8_8_ = this_05._M_pi;
    irGenerator::irGenerator::getVarName
              (&local_490,(irGenerator *)peVar21,name_00,(uint32_t)local_2a8);
    if (local_2a8[0] != (_Base_ptr)local_298) {
      operator_delete(local_2a8[0],local_298._0_8_ + 1);
    }
    local_5b8._0_8_ = local_5b8._0_8_ & 0xffffffff00000000;
    local_598 = 0;
    iVar10 = (**(this_04->super_Symbol)._vptr_Symbol)();
    if (iVar10 == 2) {
      local_4e8 = (_Base_ptr)local_4d8;
      local_4e0 = (_Base_ptr)0x0;
      local_4d8[0] = _S_red;
      local_558._0_8_ = local_558._0_8_ & 0xffffffff00000000;
      local_548.initValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      local_470._0_4_ = 0;
      local_450[0] = 0;
      if (pSVar24->layer_num == pSVar24->_initLayerNum) {
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                  ((string *)local_528,(irGenerator *)peVar21,Ptr);
        std::__cxx11::string::operator=((string *)&local_4e8,(string *)local_528);
        if (local_528 != (undefined1  [8])(local_528 + 0x10)) {
          operator_delete((void *)local_528,
                          CONCAT71(local_518._M_allocated_capacity._1_7_,local_518._M_local_buf[0])
                          + 1);
        }
        local_170._0_8_ = (long)&local_170 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,local_4e8,
                   (undefined1 *)((long)&local_4e0->_M_color + (long)local_4e8));
        local_150 = 1;
        local_120._0_8_ = (long)&local_120 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_120,local_490._M_dataplus._M_p,
                   local_490._M_dataplus._M_p + local_490._M_string_length);
        local_100 = 1;
        irGenerator::irGenerator::ir_ref
                  ((irGenerator *)peVar21,(LeftVal *)&local_170._M_first,
                   (LeftVal *)&local_120._M_first,false);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_100]._M_data)
                  ((anon_class_1_0_00000001 *)local_528,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_120._M_first);
        local_100 = 0xff;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_150]._M_data)
                  ((anon_class_1_0_00000001 *)local_528,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_170._M_first);
        local_150 = 0xff;
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_4e8);
      }
      local_548.initValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_578.
                    super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_498 = (irGenerator *)peVar21;
      if (local_578.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_578.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar17 = 0;
        op2 = (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_80 + 0x28);
        iVar10 = 0;
        local_3d8 = local_578.
                    super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        _Var27._M_pi = this_05._M_pi;
        do {
          peVar21 = *(element_type **)
                     ((long)&(local_3d8->
                             super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar17 * 4);
          p_Var25 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&(local_3d8->
                             super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                             )._M_refcount._M_pi + lVar17 * 4);
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
            }
          }
          iVar11 = (**(this_04->super_Symbol)._vptr_Symbol)();
          this_05._M_pi = _Var27._M_pi;
          if (iVar11 == 2) {
            if (_Var27._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (_Var27._M_pi)->_M_use_count = (_Var27._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (_Var27._M_pi)->_M_use_count = (_Var27._M_pi)->_M_use_count + 1;
              }
            }
            if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
              }
            }
            local_438._0_8_ = peVar21;
            local_438._8_8_ = p_Var25;
            std::
            vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            ::push_back(&this_04->_values,(value_type *)local_438);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_);
            }
            if (_Var27._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var27._M_pi);
            }
          }
          iVar11 = *(int *)&(((_Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&peVar21->_type)->
                            super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>).
                            super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                            super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                            super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                            super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>
                            ._M_u;
          if (iVar11 == 1) {
            std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                      ((variant<int,int,std::__cxx11::string> *)local_5b8,&peVar21->_name);
LAB_001a0baf:
            this_01 = local_498;
            if (iVar10 == 0) {
              local_3a8._0_8_ = (long)&local_3a8 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3a8,local_4e8,
                         (undefined1 *)((long)&local_4e0->_M_color + (long)local_4e8));
              local_388 = 1;
              std::__detail::__variant::
              _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_a8,
                                (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_5b8);
              irGenerator::irGenerator::ir_store(local_498,(LeftVal *)&local_3a8._M_first,&local_a8)
              ;
              peVar21 = (element_type *)local_528;
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr
                [local_a8.
                 super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                 super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                 super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                 super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                 super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]
                ._M_data)((anon_class_1_0_00000001 *)peVar21,&local_a8);
              local_a8.
              super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
              super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
              super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
              super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
              super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index =
                   0xff;
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[(byte)local_388]._M_data)
                        ((anon_class_1_0_00000001 *)peVar21,
                         (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_3a8._M_first);
              local_388 = -1;
            }
            else {
              local_528 = (undefined1  [8])(local_528 + 0x10);
              local_520 = (_Base_ptr)0x0;
              local_518._M_local_buf[0] = '\0';
              local_580 = p_Var25;
              irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_2c8,local_498,Ptr);
              std::__cxx11::string::operator=((string *)local_528,(string *)&local_2c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
              }
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr
                [(byte)local_548.initValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish]._M_data)
                        ((anon_class_1_0_00000001 *)&local_2c8,
                         (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_558);
              local_558._0_4_ = (int)lVar17;
              local_548.initValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish._0_1_ = 0;
              std::get<0ul,int,int,std::__cxx11::string>
                        ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_558);
              local_330._0_8_ = local_330 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_330,local_528,
                         (pointer)((long)&local_520->_M_color + (long)local_528));
              local_310 = 1;
              local_358._0_8_ = local_358 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_358,local_4e8,
                         (undefined1 *)((long)&local_4e0->_M_color + (long)local_4e8));
              local_338 = 2;
              std::__detail::__variant::
              _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)op2,(_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_558);
              irGenerator::irGenerator::ir_op
                        (this_01,(LeftVal *)local_330,(RightVal *)local_358,op2,Add);
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[local_38]._M_data)((anon_class_1_0_00000001 *)&local_2c8,op2);
              local_38 = 0xff;
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[local_338]._M_data)
                        ((anon_class_1_0_00000001 *)&local_2c8,
                         (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_358);
              p_Var25 = local_580;
              local_338 = 0xff;
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[local_310]._M_data)
                        ((anon_class_1_0_00000001 *)&local_2c8,
                         (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_330);
              local_310 = 0xff;
              local_380._0_8_ = (long)&local_380 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_380,local_528,
                         (pointer)((long)&local_520->_M_color + (long)local_528));
              local_360 = 1;
              peVar21 = (element_type *)local_80;
              std::__detail::__variant::
              _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)peVar21,
                                (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_5b8);
              irGenerator::irGenerator::ir_store
                        (this_01,(LeftVal *)&local_380._M_first,(RightVal *)peVar21);
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[local_80[0x20]]._M_data)
                        ((anon_class_1_0_00000001 *)&local_2c8,
                         (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)peVar21);
              local_80[0x20] = 0xff;
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[local_360]._M_data)
                        ((anon_class_1_0_00000001 *)&local_2c8,
                         (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_380._M_first);
              local_360 = 0xff;
              if (local_528 != (undefined1  [8])(local_528 + 0x10)) {
                operator_delete((void *)local_528,
                                CONCAT71(local_518._M_allocated_capacity._1_7_,
                                         local_518._M_local_buf[0]) + 1);
              }
            }
          }
          else if ((iVar11 == 0) && (peVar21->_value != 0)) {
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
              ::_S_vtable._M_arr[local_598]._M_data)
                      ((anon_class_1_0_00000001 *)local_528,
                       (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_5b8);
            local_5b8._0_4_ = peVar21->_value;
            local_598 = 0;
            std::get<0ul,int,int,std::__cxx11::string>
                      ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_5b8);
            goto LAB_001a0baf;
          }
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          lVar2 = lVar17 * 4;
          iVar10 = iVar10 + -1;
          lVar17 = lVar17 + 4;
          _Var27._M_pi = this_05._M_pi;
        } while ((_Hash_node_base *)
                 ((long)&local_3d8[1].
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar2) !=
                 (_Hash_node_base *)
                 local_548.initValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_450[0]]._M_data)
                ((anon_class_1_0_00000001 *)local_528,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_470);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr
        [(byte)local_548.initValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish]._M_data)
                ((anon_class_1_0_00000001 *)local_470,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_558);
      pSVar24 = local_588;
      if (local_4e8 != (_Base_ptr)local_4d8) {
        operator_delete(local_4e8,CONCAT71(local_4d8._1_7_,local_4d8[0]) + 1);
      }
    }
    else {
      peVar4 = ((local_578.
                 super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var25 = ((local_578.
                  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
        }
      }
      if (peVar4->_type == 0) {
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_598]._M_data)
                  ((anon_class_1_0_00000001 *)local_558,
                   (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_5b8);
        local_5b8._0_4_ = peVar4->_value;
        local_598 = 0;
        std::get<0ul,int,int,std::__cxx11::string>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_5b8);
      }
      else {
        std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                  ((variant<int,int,std::__cxx11::string> *)local_5b8,&peVar4->_name);
      }
      if (pSVar24->layer_num == pSVar24->_initLayerNum) {
        local_558._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_548.changed = false;
        local_558._0_8_ = &local_548;
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                  ((string *)local_470,(irGenerator *)peVar21,Ptr);
        std::__cxx11::string::operator=((string *)local_558,(string *)local_470);
        if ((undefined1 *)CONCAT44(local_470._4_4_,local_470._0_4_) != local_470 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_470._4_4_,local_470._0_4_),
                          (ulong)(local_470._16_8_ + 1));
        }
        local_198._0_8_ = (long)&local_198 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_558._0_8_,local_558._8_8_ + local_558._0_8_);
        local_178 = 1;
        local_148._0_8_ = (long)&local_148 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_490._M_dataplus._M_p,
                   local_490._M_dataplus._M_p + local_490._M_string_length);
        local_128 = 1;
        irGenerator::irGenerator::ir_ref
                  ((irGenerator *)peVar21,(LeftVal *)&local_198._M_first,
                   (LeftVal *)&local_148._M_first,false);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_128]._M_data)
                  ((anon_class_1_0_00000001 *)local_470,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_148._M_first);
        local_128 = 0xff;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_178]._M_data)
                  ((anon_class_1_0_00000001 *)local_470,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_198._M_first);
        local_178 = 0xff;
        local_1c0._0_8_ = (long)&local_1c0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c0,local_558._0_8_,local_558._8_8_ + local_558._0_8_);
        local_1a0 = 1;
        std::__detail::__variant::
        _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_d0,
                          (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_5b8);
        irGenerator::irGenerator::ir_store
                  ((irGenerator *)peVar21,(LeftVal *)&local_1c0._M_first,&local_d0);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr
          [local_d0.
           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index].
          _M_data)((anon_class_1_0_00000001 *)local_470,&local_d0);
        local_d0.
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_1a0]._M_data)
                  ((anon_class_1_0_00000001 *)local_470,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c0._M_first);
        local_1a0 = 0xff;
        if ((element_type *)local_558._0_8_ != &local_548) {
          operator_delete((void *)local_558._0_8_,CONCAT71(local_548._1_7_,local_548.changed) + 1);
        }
      }
      else {
        local_1e8._0_8_ = (long)&local_1e8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,local_490._M_dataplus._M_p,
                   local_490._M_dataplus._M_p + local_490._M_string_length);
        local_1c8 = 1;
        std::__detail::__variant::
        _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_f8,
                          (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_5b8);
        irGenerator::irGenerator::ir_assign
                  ((irGenerator *)peVar21,(LeftVal *)&local_1e8._M_first,&local_f8);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr
          [local_f8.
           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index].
          _M_data)((anon_class_1_0_00000001 *)local_558,&local_f8);
        local_f8.
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_1c8]._M_data)
                  ((anon_class_1_0_00000001 *)local_558,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e8._M_first);
        local_1c8 = 0xff;
      }
      if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
      }
    }
    iVar10 = (int)peVar21;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_598]._M_data)
              ((anon_class_1_0_00000001 *)local_558,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p,
                      (ulong)(local_490.field_2._M_allocated_capacity + 1));
    }
  }
  if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
    }
  }
  local_450._8_8_ = this_04;
  local_440._M_p = (pointer)this_05._M_pi;
  symbolTable::SymbolTable::push_symbol(&pSVar24->symbolTable,(SharedSyPtr *)(local_450 + 8));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_440._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_440._M_p);
  }
  if ((local_578.
       super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_578.
       super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (pSVar24->layer_num == pSVar24->_initLayerNum)
     ) {
    iVar11 = (**(this_04->super_Symbol)._vptr_Symbol)();
    psVar14 = local_578.
              super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar11 == 2) {
      local_5b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_5b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5a8._M_allocated_capacity = 0;
      if (local_578.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_578.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        psVar18 = local_578.
                  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          peVar21 = (psVar18->
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          if (peVar21->_type != 0) goto LAB_001a1590;
          __args = &peVar21->_value;
          if (local_5b8._8_8_ == local_5a8._M_allocated_capacity) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)local_5b8,(iterator)local_5b8._8_8_,__args
                      );
          }
          else {
            *(int *)local_5b8._8_8_ = *__args;
            local_5b8._8_8_ = local_5b8._8_8_ + 4;
          }
          psVar18 = psVar18 + 1;
        } while (psVar18 != psVar14);
      }
      local_558._8_8_ = operator_new(0x30);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_001ecca0;
      peVar1 = (element_type *)(local_558._8_8_ + 0x10);
      *(undefined2 *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x10))->
        _vptr__Sp_counted_base = 0x100;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x10))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x10))->_M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x20))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x20))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x20))->_M_weak_count = 0;
      local_558._0_8_ = peVar1;
      std::vector<int,std::allocator<int>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x10))->
                  _M_use_count,local_5b8._0_8_,local_5b8._8_8_);
      pcVar5 = (this_04->super_Symbol)._name._M_dataplus._M_p;
      local_2e8[0] = (_Base_ptr)local_2d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2e8,pcVar5,pcVar5 + (this_04->super_Symbol)._name._M_string_length)
      ;
      name_01._4_12_ = in_stack_fffffffffffffa2c;
      name_01._M_dataplus._M_p._0_4_ = iVar9;
      name_01.field_2._M_allocated_capacity = (size_type)this_04;
      name_01.field_2._8_8_ = this_05._M_pi;
      irGenerator::irGenerator::getVarName
                (&local_208,&pSVar24->irGenerator,name_01,(uint32_t)local_2e8);
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                ::operator[](&(pSVar24->bmirVariableTable).name2VarArray,&local_208);
      (pmVar13->
      super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = peVar1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar13->
                  super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_558 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_2e8[0] != (_Base_ptr)local_2d8) {
        operator_delete(local_2e8[0],(ulong)((long)&local_2d8[0]->_M_color + 1));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_);
      }
LAB_001a1590:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_5b8._0_8_,local_5a8._M_allocated_capacity - local_5b8._0_8_);
      }
    }
    else {
      iVar11 = (**(this_04->super_Symbol)._vptr_Symbol)();
      if (iVar11 == 0) {
        psVar14 = local_578.
                  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_578.
            super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_578.
            super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            peVar21 = (psVar14->
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
            if (peVar21->_type != 0) goto LAB_001a16f7;
            psVar14 = psVar14 + 1;
          } while (psVar14 !=
                   local_578.
                   super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          iVar10 = peVar21->_value;
        }
        local_5b8._8_8_ = operator_new(0x18);
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_)->_M_use_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_)->_M_weak_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_)->_vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_001eccf0;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_5b8._8_8_ + 0x10);
        *(undefined2 *)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5b8._8_8_ + 0x10))->
          _vptr__Sp_counted_base = 0x100;
        *(int *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5b8._8_8_ + 0x10))->
                        _vptr__Sp_counted_base + 4) = iVar10;
        pcVar5 = (this_04->super_Symbol)._name._M_dataplus._M_p;
        local_5b8._0_8_ = paVar19;
        local_308[0] = (_Base_ptr)local_2f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_308,pcVar5,
                   pcVar5 + (this_04->super_Symbol)._name._M_string_length);
        pSVar24 = local_588;
        name_02._4_12_ = in_stack_fffffffffffffa2c;
        name_02._M_dataplus._M_p._0_4_ = iVar9;
        name_02.field_2._M_allocated_capacity = (size_type)this_04;
        name_02.field_2._8_8_ = this_05._M_pi;
        irGenerator::irGenerator::getVarName
                  (&local_228,&local_588->irGenerator,name_02,(uint32_t)local_308);
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                  ::operator[](&(pSVar24->bmirVariableTable).name2VarSingle,&local_228);
        (pmVar15->
        super___shared_ptr<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr = (element_type *)paVar19;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar15->
                    super___shared_ptr<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5b8 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if (local_308[0] != (_Base_ptr)local_2f8) {
          operator_delete(local_308[0],local_2f8._0_8_ + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_);
        }
      }
    }
  }
LAB_001a16f7:
  if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_05._M_pi);
  }
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector(&local_578);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             *)(local_4d8 + 0x10));
  if (local_4a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((undefined1 *)local_508._M_allocated_capacity != local_4f8) {
    operator_delete((void *)local_508._M_allocated_capacity,
                    CONCAT71(local_4f8._1_7_,local_4f8[0]) + 1);
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_var_def() {
  string name;
  SymbolKind kind;
  SharedExNdPtr dimension;
  vector<SharedExNdPtr> dimensions;
  vector<SharedExNdPtr> init_values;
  SharedSyPtr symbol;
  irGenerator::localArrayInitType initType;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    kind = SymbolKind::Array;
    while (try_word(1, Token::LBRACK)) {
      match_one_word(Token::LBRACK);
      dimension = gm_const_exp();
      dimensions.push_back(dimension);
      match_one_word(Token::RBRACK);
    }
  } else {
    kind = SymbolKind::INT;
  }

  if (try_word(1, Token::ASSIGN)) {
    match_one_word(Token::ASSIGN);
    if (try_word(1, Token::LBRACE)) {
      match_one_word(Token::LBRACE);
      gm_init_val(init_values, dimensions, 0);
      match_one_word(Token::RBRACE);
    } else {
      gm_init_val(init_values, dimensions, 0);
    }
  }

  if (kind == SymbolKind::INT) {
    symbol.reset(new IntSymbol(name, layer_num, false));
    irGenerator.ir_declare_value(name, kind, symbol->getId(), {});
  } else {
    vector<uint32_t> inits;

    symbol.reset(new ArraySymbol(name, IntSymbol::getHolderIntSymbol(),
                                 layer_num, false, false));
    for (auto var : dimensions) {
      std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(var);
    }

    if (inGlobalLayer()) {
      if (init_values.empty()) {
        for (int i = 0;
             i < std::static_pointer_cast<ArraySymbol>(symbol)->getLen(); i++) {
          inits.push_back(0);
        }
      } else {
        for (auto value : init_values) {
          if (value->_type == NodeType::CNS) {
            inits.push_back(value->_value);
          } else {
            inits.push_back(0);
          }
        }
      }
    }

    if (std::static_pointer_cast<ArraySymbol>(symbol)->getLen() <=
        irGenerator::TopLocalSmallArrayLength) {
      if (!init_values.empty()) {
        initType = irGenerator::localArrayInitType::SmallInit;
      } else {
        initType = irGenerator::localArrayInitType::Small;
      }
    } else {
      if (!init_values.empty()) {
        initType = irGenerator::localArrayInitType::BigInit;
      } else {
        initType = irGenerator::localArrayInitType::BigNoInit;
      }
    }

    irGenerator.ir_declare_value(
        name, kind, symbol->getId(), inits, initType,
        std::static_pointer_cast<ArraySymbol>(symbol)->getLen());
  }

  if (init_values.size() > 0) {
    string valueName = irGenerator.getVarName(name, symbol->getId());
    irGenerator::RightVal rightVal;

    if (symbol->kind() == SymbolKind::Array) {
      string initPtr;
      bool needAssgin;
      int offset = 0;
      RightVal rightvalue1;
      RightVal rightvalue2;

      if (inGlobalLayer()) {
        initPtr = irGenerator.getNewTmpValueName(TyKind::Ptr);
        irGenerator.ir_ref(initPtr, valueName);
      } else {
        initPtr = valueName;
      }

      for (auto var : init_values) {
        needAssgin = false;
        if (symbol->kind() == SymbolKind::Array) {
          std::static_pointer_cast<ArraySymbol>(symbol)->addValue(var);
        }

        if (var->_type == NodeType::CNS && var->_value != 0) {
          rightVal.emplace<0>(var->_value);
          needAssgin = true;
        } else if (var->_type == NodeType::VAR) {
          rightVal.emplace<2>(var->_name);
          needAssgin = true;
        }

        if (needAssgin) {
          if (offset > 0) {
            string addr;

            addr = irGenerator.getNewTmpValueName(mir::types::TyKind::Ptr);
            rightvalue1.emplace<0>(offset * mir::types::INT_SIZE);
            irGenerator.ir_op(addr, initPtr, rightvalue1, Op::Add);
            irGenerator.ir_store(addr, rightVal);
          } else {
            irGenerator.ir_store(initPtr, rightVal);
          }
        }
        offset++;
      }
    } else {
      SharedExNdPtr var = init_values.front();

      if (var->_type == NodeType::CNS) {
        rightVal.emplace<0>(var->_value);
      } else {
        rightVal.emplace<2>(var->_name);
      }

      if (inGlobalLayer()) {
        string addrTmp;

        addrTmp = irGenerator.getNewTmpValueName(TyKind::Ptr);
        irGenerator.ir_ref(addrTmp, valueName);
        irGenerator.ir_store(addrTmp, rightVal);
      } else {
        irGenerator.ir_assign(valueName, rightVal);
      }
    }
  }
  symbolTable.push_symbol(symbol);

  if (!init_values.empty()) {
    if (inGlobalLayer()) {
      if (symbol->kind() == SymbolKind::Array) {
        bool isConst = true;
        std::vector<int32_t> constValues;

        for (auto &value : init_values) {
          if (value->_type == NodeType::CNS) {
            constValues.push_back(value->_value);
          } else {
            isConst = false;
            break;
          }
        }

        if (isConst) {
          std::shared_ptr<optimization::bmir_variable_table::VarArray>
              varArray =
                  std::make_shared<optimization::bmir_variable_table::VarArray>(
                      isConst);

          varArray->initValues.assign(constValues.begin(), constValues.end());
          bmirVariableTable.insertVarArray(
              irGenerator.getVarName(symbol->getName(), symbol->getId()),
              varArray);
        }
      } else if (symbol->kind() == SymbolKind::INT) {
        bool isConst = true;
        int32_t constValue;

        for (auto &value : init_values) {
          if (value->_type == NodeType::CNS) {
            constValue = value->_value;
          } else {
            isConst = false;
            break;
          }
        }

        if (isConst) {
          std::shared_ptr<optimization::bmir_variable_table::VarSingle>
              varSingle = std::make_shared<
                  optimization::bmir_variable_table::VarSingle>(isConst);

          varSingle->initValue = constValue;
          bmirVariableTable.insertVarSingle(
              irGenerator.getVarName(symbol->getName(), symbol->getId()),
              varSingle);
        }
      }
    }
  }
}